

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O1

void lysc_node_free_(lysf_ctx *ctx,lysc_node *node)

{
  ushort uVar1;
  lys_module *plVar2;
  long lVar3;
  lysc_node *plVar4;
  char *pcVar5;
  lysc_ext_instance *plVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  lysc_node *plVar17;
  uint64_t c__;
  ulong uVar18;
  void *pvVar19;
  uint64_t c___7;
  long lVar20;
  
  lydict_remove(ctx->ctx,node->name);
  lydict_remove(ctx->ctx,node->dsc);
  lydict_remove(ctx->ctx,node->ref);
  uVar1 = node->nodetype;
  if (0x7f < uVar1) {
    if (uVar1 < 0x400) {
      if (uVar1 != 0x80) {
        if ((uVar1 == 0x100) || (uVar1 == 0x200)) {
          lVar20 = 0;
          uVar18 = 0;
          while( true ) {
            lVar3 = *(long *)(node + 1);
            if (lVar3 == 0) {
              uVar8 = 0;
            }
            else {
              uVar8 = *(ulong *)(lVar3 + -8);
            }
            if (uVar8 <= uVar18) break;
            lysc_when_free(ctx,(lysc_when **)(lVar3 + lVar20));
            uVar18 = uVar18 + 1;
            lVar20 = lVar20 + 8;
          }
          if (lVar3 != 0) {
            free((void *)(lVar3 + -8));
          }
          if (*(short *)&node[1].module != 0) {
            lysc_node_free_(ctx,(lysc_node *)&node[1].module);
          }
          bVar7 = true;
          if (*(short *)&node[2].next != 0) {
            lysc_node_free_(ctx,(lysc_node *)&node[2].next);
          }
          goto LAB_0016018f;
        }
        goto switchD_0015fb1e_caseD_3;
      }
      lVar20 = 0;
      uVar18 = 0;
      while( true ) {
        plVar2 = node[1].module;
        if (plVar2 == (lys_module *)0x0) {
          uVar15 = 0;
        }
        else {
          uVar15._0_1_ = plVar2[-1].implemented;
          uVar15._1_1_ = plVar2[-1].to_compile;
          uVar15._2_1_ = plVar2[-1].latest_revision;
          uVar15._3_5_ = *(undefined5 *)&plVar2[-1].field_0x7b;
        }
        if (uVar15 <= uVar18) break;
        lysc_when_free(ctx,(lysc_when **)((long)&plVar2->ctx + lVar20));
        uVar18 = uVar18 + 1;
        lVar20 = lVar20 + 8;
      }
      if (plVar2 != (lys_module *)0x0) {
        free(&plVar2[-1].implemented);
      }
      plVar17 = *(lysc_node **)(node + 1);
      while (plVar17 != (lysc_node *)0x0) {
        plVar4 = plVar17->next;
        lysc_node_free_(ctx,plVar17);
        plVar17 = plVar4;
      }
    }
    else {
      if ((uVar1 == 0x2000) || (uVar1 == 0x1000)) {
        lVar20 = 0;
        uVar18 = 0;
        while( true ) {
          plVar2 = node[1].module;
          if (plVar2 == (lys_module *)0x0) {
            uVar8 = 0;
          }
          else {
            uVar8._0_1_ = plVar2[-1].implemented;
            uVar8._1_1_ = plVar2[-1].to_compile;
            uVar8._2_1_ = plVar2[-1].latest_revision;
            uVar8._3_5_ = *(undefined5 *)&plVar2[-1].field_0x7b;
          }
          if (uVar8 <= uVar18) break;
          lysc_must_free(ctx,(lysc_must *)((long)&plVar2->ctx + lVar20));
          uVar18 = uVar18 + 1;
          lVar20 = lVar20 + 0x38;
        }
        if (plVar2 != (lys_module *)0x0) {
          free(&plVar2[-1].implemented);
        }
        plVar17 = *(lysc_node **)(node + 1);
        while (plVar17 != (lysc_node *)0x0) {
          plVar4 = plVar17->next;
          lysc_node_free_(ctx,plVar17);
          plVar17 = plVar4;
        }
        bVar7 = false;
        goto LAB_0016018f;
      }
      if (uVar1 != 0x400) goto switchD_0015fb1e_caseD_3;
      lVar20 = 0;
      pvVar19 = (void *)0x0;
      while( true ) {
        plVar17 = node[1].parent;
        if (plVar17 == (lysc_node *)0x0) {
          pvVar10 = (void *)0x0;
        }
        else {
          pvVar10 = plVar17[-1].priv;
        }
        if (pvVar10 <= pvVar19) break;
        lysc_when_free(ctx,(lysc_when **)(plVar17->hash + lVar20 + -4));
        pvVar19 = (void *)((long)pvVar19 + 1);
        lVar20 = lVar20 + 8;
      }
      if (plVar17 != (lysc_node *)0x0) {
        free(&plVar17[-1].priv);
      }
      lVar20 = 0;
      uVar18 = 0;
      while( true ) {
        plVar2 = node[1].module;
        if (plVar2 == (lys_module *)0x0) {
          uVar16 = 0;
        }
        else {
          uVar16._0_1_ = plVar2[-1].implemented;
          uVar16._1_1_ = plVar2[-1].to_compile;
          uVar16._2_1_ = plVar2[-1].latest_revision;
          uVar16._3_5_ = *(undefined5 *)&plVar2[-1].field_0x7b;
        }
        if (uVar16 <= uVar18) break;
        lysc_must_free(ctx,(lysc_must *)((long)&plVar2->ctx + lVar20));
        uVar18 = uVar18 + 1;
        lVar20 = lVar20 + 0x38;
      }
      if (plVar2 != (lys_module *)0x0) {
        free(&plVar2[-1].implemented);
      }
      plVar17 = *(lysc_node **)(node + 1);
      while (plVar17 != (lysc_node *)0x0) {
        plVar4 = plVar17->next;
        lysc_node_free_(ctx,plVar17);
        plVar17 = plVar4;
      }
    }
    goto LAB_0016018c;
  }
  if (0xf < uVar1) {
    if (uVar1 != 0x10) {
      if ((uVar1 == 0x20) || (uVar1 == 0x60)) {
        lVar20 = 0;
        uVar18 = 0;
        while( true ) {
          plVar2 = node[1].module;
          if (plVar2 == (lys_module *)0x0) {
            uVar9 = 0;
          }
          else {
            uVar9._0_1_ = plVar2[-1].implemented;
            uVar9._1_1_ = plVar2[-1].to_compile;
            uVar9._2_1_ = plVar2[-1].latest_revision;
            uVar9._3_5_ = *(undefined5 *)&plVar2[-1].field_0x7b;
          }
          if (uVar9 <= uVar18) break;
          lysc_when_free(ctx,(lysc_when **)((long)&plVar2->ctx + lVar20));
          uVar18 = uVar18 + 1;
          lVar20 = lVar20 + 8;
        }
        if (plVar2 != (lys_module *)0x0) {
          free(&plVar2[-1].implemented);
        }
        lVar20 = 0;
        uVar18 = 0;
        while( true ) {
          lVar3 = *(long *)(node + 1);
          if (lVar3 == 0) {
            uVar8 = 0;
          }
          else {
            uVar8 = *(ulong *)(lVar3 + -8);
          }
          if (uVar8 <= uVar18) break;
          lysc_must_free(ctx,(lysc_must *)(lVar3 + lVar20));
          uVar18 = uVar18 + 1;
          lVar20 = lVar20 + 0x38;
        }
        bVar7 = true;
        if (lVar3 == 0) goto LAB_0016018f;
        plVar17 = (lysc_node *)(lVar3 + -8);
        goto LAB_0015ff03;
      }
      goto switchD_0015fb1e_caseD_3;
    }
    plVar17 = *(lysc_node **)(node + 1);
    while (plVar17 != (lysc_node *)0x0) {
      plVar4 = plVar17->next;
      lysc_node_free_(ctx,plVar17);
      plVar17 = plVar4;
    }
    lVar20 = 0;
    pvVar19 = (void *)0x0;
    while( true ) {
      plVar17 = node[1].parent;
      if (plVar17 == (lysc_node *)0x0) {
        pvVar10 = (void *)0x0;
      }
      else {
        pvVar10 = plVar17[-1].priv;
      }
      if (pvVar10 <= pvVar19) break;
      lysc_when_free(ctx,(lysc_when **)(plVar17->hash + lVar20 + -4));
      pvVar19 = (void *)((long)pvVar19 + 1);
      lVar20 = lVar20 + 8;
    }
    if (plVar17 != (lysc_node *)0x0) {
      free(&plVar17[-1].priv);
    }
    lVar20 = 0;
    uVar18 = 0;
    while( true ) {
      plVar2 = node[1].module;
      if (plVar2 == (lys_module *)0x0) {
        uVar14 = 0;
      }
      else {
        uVar14._0_1_ = plVar2[-1].implemented;
        uVar14._1_1_ = plVar2[-1].to_compile;
        uVar14._2_1_ = plVar2[-1].latest_revision;
        uVar14._3_5_ = *(undefined5 *)&plVar2[-1].field_0x7b;
      }
      if (uVar14 <= uVar18) break;
      lysc_must_free(ctx,(lysc_must *)((long)&plVar2->ctx + lVar20));
      uVar18 = uVar18 + 1;
      lVar20 = lVar20 + 0x38;
    }
    if (plVar2 != (lys_module *)0x0) {
      free(&plVar2[-1].implemented);
    }
    uVar18 = 0;
    while( true ) {
      pcVar5 = node[1].name;
      if (pcVar5 == (char *)0x0) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(ulong *)(pcVar5 + -8);
      }
      if (uVar8 <= uVar18) break;
      if (*(long *)(pcVar5 + uVar18 * 8) != 0) {
        free((void *)(*(long *)(pcVar5 + uVar18 * 8) + -8));
      }
      uVar18 = uVar18 + 1;
    }
    if (pcVar5 != (char *)0x0) {
      free(pcVar5 + -8);
    }
    plVar17 = node[1].next;
    while (plVar17 != (lysc_node *)0x0) {
      plVar4 = plVar17->next;
      lysc_node_free_(ctx,plVar17);
      plVar17 = plVar4;
    }
    plVar17 = node[1].prev;
    while (plVar17 != (lysc_node *)0x0) {
      plVar4 = plVar17->next;
      lysc_node_free_(ctx,plVar17);
      plVar17 = plVar4;
    }
    goto LAB_0016018c;
  }
  switch(uVar1) {
  case 1:
    lysc_node_container_free(ctx,(lysc_node_container *)node);
    break;
  case 2:
    lVar20 = 0;
    uVar18 = 0;
    while( true ) {
      plVar2 = node[1].module;
      if (plVar2 == (lys_module *)0x0) {
        uVar13 = 0;
      }
      else {
        uVar13._0_1_ = plVar2[-1].implemented;
        uVar13._1_1_ = plVar2[-1].to_compile;
        uVar13._2_1_ = plVar2[-1].latest_revision;
        uVar13._3_5_ = *(undefined5 *)&plVar2[-1].field_0x7b;
      }
      if (uVar13 <= uVar18) break;
      lysc_when_free(ctx,(lysc_when **)((long)&plVar2->ctx + lVar20));
      uVar18 = uVar18 + 1;
      lVar20 = lVar20 + 8;
    }
    if (plVar2 != (lys_module *)0x0) {
      free(&plVar2[-1].implemented);
    }
    plVar17 = *(lysc_node **)(node + 1);
    while (plVar17 != (lysc_node *)0x0) {
      plVar4 = plVar17->next;
      lysc_node_free_(ctx,plVar17);
      plVar17 = plVar4;
    }
    break;
  default:
switchD_0015fb1e_caseD_3:
    ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_free.c"
           ,0x4b1);
    break;
  case 4:
    lVar20 = 0;
    uVar18 = 0;
    while( true ) {
      plVar2 = node[1].module;
      if (plVar2 == (lys_module *)0x0) {
        uVar12 = 0;
      }
      else {
        uVar12._0_1_ = plVar2[-1].implemented;
        uVar12._1_1_ = plVar2[-1].to_compile;
        uVar12._2_1_ = plVar2[-1].latest_revision;
        uVar12._3_5_ = *(undefined5 *)&plVar2[-1].field_0x7b;
      }
      if (uVar12 <= uVar18) break;
      lysc_when_free(ctx,(lysc_when **)((long)&plVar2->ctx + lVar20));
      uVar18 = uVar18 + 1;
      lVar20 = lVar20 + 8;
    }
    if (plVar2 != (lys_module *)0x0) {
      free(&plVar2[-1].implemented);
    }
    lVar20 = 0;
    uVar18 = 0;
    while( true ) {
      lVar3 = *(long *)(node + 1);
      if (lVar3 == 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(ulong *)(lVar3 + -8);
      }
      if (uVar8 <= uVar18) break;
      lysc_must_free(ctx,(lysc_must *)(lVar3 + lVar20));
      uVar18 = uVar18 + 1;
      lVar20 = lVar20 + 0x38;
    }
    if (lVar3 != 0) {
      free((void *)(lVar3 + -8));
    }
    if (node[1].parent != (lysc_node *)0x0) {
      lysc_type_free(ctx,(lysc_type *)node[1].parent);
    }
    lydict_remove(ctx->ctx,(char *)node[1].next);
    bVar7 = true;
    if (node[1].prev == (lysc_node *)0x0) goto LAB_0016018f;
    (**(code **)((node[1].prev)->module->revision + 0x38))(ctx->ctx);
    lysc_type_free(ctx,(lysc_type *)(node[1].prev)->module);
    plVar17 = node[1].prev;
    goto LAB_0015ff03;
  case 8:
    lVar20 = 0;
    uVar18 = 0;
    while( true ) {
      plVar2 = node[1].module;
      if (plVar2 == (lys_module *)0x0) {
        uVar11 = 0;
      }
      else {
        uVar11._0_1_ = plVar2[-1].implemented;
        uVar11._1_1_ = plVar2[-1].to_compile;
        uVar11._2_1_ = plVar2[-1].latest_revision;
        uVar11._3_5_ = *(undefined5 *)&plVar2[-1].field_0x7b;
      }
      if (uVar11 <= uVar18) break;
      lysc_when_free(ctx,(lysc_when **)((long)&plVar2->ctx + lVar20));
      uVar18 = uVar18 + 1;
      lVar20 = lVar20 + 8;
    }
    if (plVar2 != (lys_module *)0x0) {
      free(&plVar2[-1].implemented);
    }
    lVar20 = 0;
    uVar18 = 0;
    while( true ) {
      lVar3 = *(long *)(node + 1);
      if (lVar3 == 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(ulong *)(lVar3 + -8);
      }
      if (uVar8 <= uVar18) break;
      lysc_must_free(ctx,(lysc_must *)(lVar3 + lVar20));
      uVar18 = uVar18 + 1;
      lVar20 = lVar20 + 0x38;
    }
    if (lVar3 != 0) {
      free((void *)(lVar3 + -8));
    }
    if (node[1].parent != (lysc_node *)0x0) {
      lysc_type_free(ctx,(lysc_type *)node[1].parent);
    }
    lydict_remove(ctx->ctx,(char *)node[1].next);
    pvVar19 = (void *)0x0;
    while( true ) {
      plVar17 = node[1].prev;
      if (plVar17 == (lysc_node *)0x0) {
        pvVar10 = (void *)0x0;
      }
      else {
        pvVar10 = plVar17[-1].priv;
      }
      if (pvVar10 <= pvVar19) break;
      (**(code **)(*(long *)(*(long *)(*(long *)(plVar17->hash + (long)pvVar19 * 8 + -4) + 8) + 0x10
                            ) + 0x38))(ctx->ctx);
      lysc_type_free(ctx,*(lysc_type **)
                          (*(long *)((node[1].prev)->hash + (long)pvVar19 * 8 + -4) + 8));
      free(*(void **)((node[1].prev)->hash + (long)pvVar19 * 8 + -4));
      pvVar19 = (void *)((long)pvVar19 + 1);
    }
    bVar7 = true;
    if (plVar17 == (lysc_node *)0x0) goto LAB_0016018f;
    plVar17 = (lysc_node *)&plVar17[-1].priv;
LAB_0015ff03:
    bVar7 = true;
    free(plVar17);
    goto LAB_0016018f;
  }
LAB_0016018c:
  bVar7 = true;
LAB_0016018f:
  lVar20 = 0;
  pvVar19 = (void *)0x0;
  while( true ) {
    plVar6 = node->exts;
    if (plVar6 == (lysc_ext_instance *)0x0) {
      pvVar10 = (void *)0x0;
    }
    else {
      pvVar10 = plVar6[-1].compiled;
    }
    if (pvVar10 <= pvVar19) break;
    lysc_ext_instance_free(ctx,(lysc_ext_instance *)((long)&plVar6->def + lVar20));
    pvVar19 = (void *)((long)pvVar19 + 1);
    lVar20 = lVar20 + 0x48;
  }
  if (plVar6 != (lysc_ext_instance *)0x0) {
    free(&plVar6[-1].compiled);
  }
  if (!bVar7) {
    return;
  }
  free(node);
  return;
}

Assistant:

static void
lysc_node_free_(struct lysf_ctx *ctx, struct lysc_node *node)
{
    ly_bool inout = 0;

    /* common part */
    lydict_remove(ctx->ctx, node->name);
    lydict_remove(ctx->ctx, node->dsc);
    lydict_remove(ctx->ctx, node->ref);

    /* nodetype-specific part */
    switch (node->nodetype) {
    case LYS_CONTAINER:
        lysc_node_container_free(ctx, (struct lysc_node_container *)node);
        break;
    case LYS_LEAF:
        lysc_node_leaf_free(ctx, (struct lysc_node_leaf *)node);
        break;
    case LYS_LEAFLIST:
        lysc_node_leaflist_free(ctx, (struct lysc_node_leaflist *)node);
        break;
    case LYS_LIST:
        lysc_node_list_free(ctx, (struct lysc_node_list *)node);
        break;
    case LYS_CHOICE:
        lysc_node_choice_free(ctx, (struct lysc_node_choice *)node);
        break;
    case LYS_CASE:
        lysc_node_case_free(ctx, (struct lysc_node_case *)node);
        break;
    case LYS_ANYDATA:
    case LYS_ANYXML:
        lysc_node_anydata_free(ctx, (struct lysc_node_anydata *)node);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        lysc_node_action_free(ctx, (struct lysc_node_action *)node);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        lysc_node_action_inout_free(ctx, (struct lysc_node_action_inout *)node);
        inout = 1;
        break;
    case LYS_NOTIF:
        lysc_node_notif_free(ctx, (struct lysc_node_notif *)node);
        break;
    default:
        LOGINT(ctx->ctx);
    }

    FREE_ARRAY(ctx, node->exts, lysc_ext_instance_free);

    if (!inout) {
        free(node);
    }
}